

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintExtensionsInDescriptor
          (Generator *this,Descriptor *message_descriptor)

{
  allocator local_49;
  code *local_48;
  undefined8 uStack_40;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"extensions",&local_49);
  local_48 = Descriptor::extension;
  uStack_40 = 0;
  PrintFieldDescriptorsInDescriptor(this,message_descriptor,true,&local_38,0x2c6d40,0);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Generator::PrintExtensionsInDescriptor(
    const Descriptor& message_descriptor) const {
  const bool is_extension = true;
  PrintFieldDescriptorsInDescriptor(message_descriptor, is_extension,
                                    "extensions", &Descriptor::extension_count,
                                    &Descriptor::extension);
}